

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O2

void __thiscall LiteScript::State::UseNamespace(State *this,char *name)

{
  Nullable<LiteScript::Variable> *this_00;
  Namespace *this_01;
  int iVar1;
  bool bVar2;
  int iVar3;
  Object *pOVar4;
  Type *this_02;
  ulong uVar5;
  string nsp;
  Nullable<LiteScript::Variable> v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [16];
  Nullable<LiteScript::Variable> local_50;
  
  std::__cxx11::string::string((string *)&local_80,name,(allocator *)(local_60 + 0x10));
  bVar2 = std::operator==(&local_80,"global");
  if (bVar2) {
    Namer::Use((this->nsp_lifo).
               super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>._M_impl.
               super__Vector_impl_data._M_finish + -1,&this->nsp_global);
  }
  else {
    Nullable<LiteScript::Variable>::Nullable
              ((Nullable<LiteScript::Variable> *)(local_60 + 0x10),&this->nsp_global);
    iVar1 = (int)local_80._M_string_length;
    local_80._M_string_length = 0;
    *local_80._M_dataplus._M_p = '\0';
    this_00 = (Nullable<LiteScript::Variable> *)(local_60 + 0x10);
    for (uVar5 = 0; iVar1 + 1 != uVar5; uVar5 = uVar5 + 1) {
      if ((name[uVar5] == '.') || (name[uVar5] == '\0')) {
        pOVar4 = Variable::operator->((Variable *)this_00);
        this_01 = (Namespace *)pOVar4->data;
        iVar3 = Namespace::IndexOf(this_01,local_80._M_dataplus._M_p);
        if (iVar3 < 0) {
          Memory::Create((Memory *)local_60,(Type *)this->memory);
          Nullable<LiteScript::Variable>::operator=(this_00,(Variable *)local_60);
          Variable::~Variable((Variable *)local_60);
          Namespace::DefineVariable(this_01,local_80._M_dataplus._M_p,(Variable *)this_00);
        }
        else {
          Namespace::GetVariable((Namespace *)local_60,(uint)this_01);
          Nullable<LiteScript::Variable>::operator=(this_00,(Variable *)local_60);
          Variable::~Variable((Variable *)local_60);
          pOVar4 = Variable::operator->((Variable *)this_00);
          this_02 = Object::GetType(pOVar4);
          bVar2 = Type::operator!=(this_02,(Type *)_type_namespace);
          if (bVar2) {
            UseNamespace(this,"global");
            goto LAB_0012f901;
          }
        }
      }
      else {
        std::__cxx11::string::push_back((char)&local_80);
      }
    }
    Namer::Use((this->nsp_lifo).
               super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>._M_impl.
               super__Vector_impl_data._M_finish + -1,(Variable *)(local_60 + 0x10));
LAB_0012f901:
    Nullable<LiteScript::Variable>::Nullify((Nullable<LiteScript::Variable> *)(local_60 + 0x10));
  }
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void LiteScript::State::UseNamespace(const char *name) {
    std::string nsp(name);
    if (nsp == "global") {
        this->nsp_lifo.back().Use(this->nsp_global);
        return;
    }
    Nullable<Variable> v(this->nsp_global);
    unsigned len = nsp.size() + 1;
    nsp.clear();
    for (unsigned int i = 0; i < len; i++) {
        if (name[i] == '.' || name[i] == '\0') {
            Namespace& tmp = (*v)->GetData<Namespace>();
            int index = tmp.IndexOf(nsp.c_str());
            if (index < 0) {
                v = this->memory.Create(Type::NAMESPACE);
                tmp.DefineVariable(nsp.c_str(), *v);
            }
            else {
                v = tmp.GetVariable((unsigned int)index);
                if ((*v)->GetType() != Type::NAMESPACE) {
                    this->UseNamespace();
                    return;
                }
            }
        }
        else {
            nsp += name[i];
        }
    }
    this->nsp_lifo.back().Use(*v);
}